

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNKalm.cpp
# Opt level: O0

void __thiscall NaPNKalman::NaPNKalman(NaPNKalman *this,char *szNodeName)

{
  undefined8 *in_RDI;
  char *in_stack_00000378;
  NaPetriNode *in_stack_00000380;
  uint in_stack_ffffffffffffff48;
  uint in_stack_ffffffffffffff4c;
  NaMatrix *in_stack_ffffffffffffff50;
  NaMatrix *this_00;
  NaPetriNode *in_stack_ffffffffffffff58;
  NaPetriCnInput *in_stack_ffffffffffffff60;
  NaPetriNode *in_stack_ffffffffffffff68;
  NaPetriCnOutput *in_stack_ffffffffffffff70;
  
  NaPetriNode::NaPetriNode(in_stack_00000380,in_stack_00000378);
  *in_RDI = &PTR__NaPNKalman_00195750;
  NaPetriCnInput::NaPetriCnInput
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,(char *)in_stack_ffffffffffffff50);
  NaPetriCnInput::NaPetriCnInput
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,(char *)in_stack_ffffffffffffff50);
  NaPetriCnInput::NaPetriCnInput
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,(char *)in_stack_ffffffffffffff50);
  NaPetriCnOutput::NaPetriCnOutput
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,(char *)in_stack_ffffffffffffff60);
  NaPetriCnOutput::NaPetriCnOutput
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,(char *)in_stack_ffffffffffffff60);
  NaPetriCnOutput::NaPetriCnOutput
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,(char *)in_stack_ffffffffffffff60);
  NaMatrix::NaMatrix(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48);
  NaMatrix::NaMatrix(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48);
  NaMatrix::NaMatrix(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48);
  NaMatrix::NaMatrix(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48);
  NaMatrix::NaMatrix(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48);
  NaVector::NaVector((NaVector *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
  NaVector::NaVector((NaVector *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
  NaVector::NaVector((NaVector *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
  NaMatrix::NaMatrix(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48);
  NaMatrix::NaMatrix(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48);
  this_00 = (NaMatrix *)(in_RDI + 0x74);
  NaMatrix::NaMatrix(this_00,in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48);
  NaMatrix::NaMatrix(this_00,in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48);
  return;
}

Assistant:

NaPNKalman::NaPNKalman (const char* szNodeName)
: NaPetriNode(szNodeName),
  ////////////////
  // Connectors //
  ////////////////
  u(this, "u"),
  v(this, "v"),
  w(this, "w"),
  y_obs(this, "y_obs"),
  x_est(this, "x_est"),
  x_int(this, "x_int")
{
    // Nothing to do
}